

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O0

void __thiscall
Vocabulary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Vocabulary(Vocabulary<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *words)

{
  ulong uVar1;
  size_type sVar2;
  size_t sVar3;
  reference pvVar4;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *this_00;
  size_type sVar5;
  uint64_t __n;
  reference this_01;
  long lVar6;
  char *pcVar7;
  difference_type dVar8;
  reference pvVar9;
  value_type vVar10;
  Serializable *in_RDI;
  size_t i_2;
  iterator data_end;
  size_t i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reordered_words;
  uint64_t data_size;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> hasher;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique_words;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *in_stack_fffffffffffffb98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  undefined4 in_stack_fffffffffffffba0;
  value_type in_stack_fffffffffffffba4;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffba8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffbb0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffbb8;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *in_stack_fffffffffffffbc0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffbc8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbe8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffc68;
  double in_stack_fffffffffffffc70;
  undefined8 in_stack_fffffffffffffc78;
  int num_thread;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc80;
  size_t in_stack_fffffffffffffc88;
  mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *in_stack_fffffffffffffc90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  char *__n_00;
  size_type local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  ulong local_338;
  undefined8 local_a0;
  ulong local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38 [2];
  
  Serializable::Serializable(in_RDI);
  in_RDI->_vptr_Serializable = (_func_int **)&PTR_dump_0019ba60;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10caf8);
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::mphf
            (in_stack_fffffffffffffbc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
  local_40 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb98);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb98);
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb98);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffb98);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  local_68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffb98);
  __gnu_cxx::operator-
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffb98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffbc0,(size_type)in_stack_fffffffffffffbb8._M_current);
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(local_38);
  if (0xfffffffe < sVar2) {
    __assert_fail("unique_words.size() < (~uint32_t(0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/Vocabulary.h"
                  ,0x82,"Vocabulary<std::basic_string<char>>::Vocabulary(const vector<string> &)");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size(local_38);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x10ccc2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffbc0,
             (size_type)in_stack_fffffffffffffbb8._M_current,
             (allocator_type *)in_stack_fffffffffffffbb0._M_current);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10cceb);
  local_98 = 0;
  while( true ) {
    uVar1 = local_98;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_38);
    num_thread = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    if (sVar2 <= uVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_38,local_98);
    sVar3 = std::
            hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffbb0._M_current,in_stack_fffffffffffffba8._M_current)
    ;
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_88,local_98);
    *pvVar4 = sVar3;
    local_98 = local_98 + 1;
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_88);
  if (sVar2 == 0) {
    local_a0 = 0xffffffffffffffff;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               (value_type *)in_stack_fffffffffffffb98);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_88);
  boomphf::mphf<unsigned_long,boomphf::SingleHashFunctor<unsigned_long>>::
  mphf<std::vector<unsigned_long,std::allocator<unsigned_long>>>
            (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
             num_thread,in_stack_fffffffffffffc70,SUB81((ulong)in_stack_fffffffffffffc68 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffffc68 >> 0x30,0),(float)in_stack_fffffffffffffc68);
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::operator=
            ((mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
            );
  boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::~mphf
            ((mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  local_338 = 0;
  this_00 = (mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_38);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x10ce98);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffffbc0,(size_type)in_stack_fffffffffffffbb8._M_current,
           (allocator_type *)in_stack_fffffffffffffbb0._M_current);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x10cebe);
  local_360 = 0;
  while( true ) {
    sVar2 = local_360;
    sVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_38);
    if (sVar5 <= sVar2) break;
    in_stack_fffffffffffffbc8._M_current =
         (char *)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_38,local_360);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&local_88,local_360);
    __n = boomphf::mphf<unsigned_long,_boomphf::SingleHashFunctor<unsigned_long>_>::lookup
                    (this_00,sVar2);
    this_01 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_350,__n);
    std::__cxx11::string::operator=
              ((string *)this_01,(string *)in_stack_fffffffffffffbc8._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_38,local_360);
    lVar6 = std::__cxx11::string::length();
    local_338 = lVar6 + local_338;
    local_360 = local_360 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x10d032);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10d03f);
  if (local_338 < 0xffffffff) {
    std::__cxx11::string::resize((ulong)(in_RDI + 1));
    std::__cxx11::string::begin();
    __last._M_current = (char *)(in_RDI + 5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::size(&local_350);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__last._M_current,
               (size_type)in_stack_fffffffffffffbb8._M_current);
    __result._M_current = (char *)0x0;
    while( true ) {
      __n_00 = __result._M_current;
      pcVar7 = (char *)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&local_350);
      if (pcVar7 <= __result._M_current) break;
      std::__cxx11::string::begin();
      dVar8 = __gnu_cxx::operator-
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffba4 = (value_type)dVar8;
      pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 5),
                          (size_type)__n_00);
      *pvVar9 = in_stack_fffffffffffffba4;
      this_03 = &local_350;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this_03,(size_type)__n_00);
      std::__cxx11::string::begin();
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this_03,(size_type)__n_00);
      std::__cxx11::string::end();
      in_stack_fffffffffffffbb0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                     (in_stack_fffffffffffffbc8,__last,__result);
      __result._M_current = __n_00 + 1;
    }
    std::__cxx11::string::begin();
    dVar8 = __gnu_cxx::operator-
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_fffffffffffffb98);
    vVar10 = (value_type)dVar8;
    this_02 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 5);
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_350);
    pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_02,sVar2);
    *pvVar9 = vVar10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbb0._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffbb0._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbb0._M_current);
    return;
  }
  __assert_fail("data_size < (~uint32_t(0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pavellevap[P]ngram_storage/src/Vocabulary.h"
                ,0x95,"Vocabulary<std::basic_string<char>>::Vocabulary(const vector<string> &)");
}

Assistant:

Vocabulary(const vector<string> &words) {
        vector<string> unique_words(words);
        sort(unique_words.begin(), unique_words.end());
        auto it = unique(unique_words.begin(), unique_words.end());
        unique_words.resize(size_t(it - unique_words.begin()));

        assert(unique_words.size() < (~uint32_t(0)));

        std::hash<string> hasher;
        vector<uint64_t> hashes(unique_words.size());
        for (size_t i = 0; i < unique_words.size(); i++)
            hashes[i] = hasher(unique_words[i]);
        if (hashes.size() == 0) // mphf cannot be serialized if key set is empty
            hashes.push_back(ULLONG_MAX);
        mphf = BooPHF(hashes.size(), hashes, 8, 2.0, true, false);

        uint64_t data_size = 0;
        vector<string> reordered_words(unique_words.size());
        for (size_t i = 0; i < unique_words.size(); i++) {
            reordered_words[mphf.lookup(hashes[i])] = unique_words[i];
            data_size += unique_words[i].length();
        }
        unique_words.clear();
        hashes.clear();

        assert(data_size < (~uint32_t(0)));

        data.resize(data_size);
        auto data_end = data.begin();
        offsets.resize(reordered_words.size() + 1);
        for (size_t i = 0; i < reordered_words.size(); i++) {
            offsets[i] = uint32_t(data_end - data.begin());
            data_end = copy(reordered_words[i].begin(), reordered_words[i].end(), data_end);
        }
        offsets[reordered_words.size()] = uint32_t(data_end - data.begin());
    }